

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

void __thiscall siamese::EncoderPacketWindow::StartNewWindow(EncoderPacketWindow *this,uint column)

{
  ostringstream *this_00;
  undefined1 auVar1 [16];
  long lVar2;
  OutputWorker *this_01;
  LogStringBuffer local_198;
  
  auVar1 = vpshufb_avx(ZEXT416(column & 7),_DAT_001a42e0);
  this->ColumnStart = column & 0xfffffff8;
  this->Count = (column & 7) + 1;
  this->LongestPacket = auVar1._0_4_;
  this->FirstUnremovedElement = auVar1._4_4_;
  this->SumStartElement = auVar1._8_4_;
  this->SumEndElement = auVar1._12_4_;
  for (lVar2 = 0x158; lVar2 != 0x398; lVar2 = lVar2 + 0x48) {
    *(undefined4 *)((long)(this->Subwindows).PreallocatedData + lVar2 + -0x38) = 0;
  }
  if (DAT_001ff848 < 3) {
    this_00 = &local_198.LogStream;
    local_198.ChannelName = Logger;
    local_198.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,(string *)&DAT_001ff878);
    std::operator<<((ostream *)this_00,">>> Starting a new window from column ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  return;
}

Assistant:

void EncoderPacketWindow::StartNewWindow(unsigned column)
{
    // Maintain the invariant that element % 8 == column % 8 by skipping some
    const unsigned element = column % kColumnLaneCount;
    ColumnStart            = column - element;
    SIAMESE_DEBUG_ASSERT(column >= element && ColumnStart < kColumnPeriod);
    SumStartElement        = element;
    SumEndElement          = element;
    FirstUnremovedElement  = element;
    Count                  = element + 1;

    // Reset longest packet
    LongestPacket = 0;
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex) {
        Lanes[laneIndex].LongestPacket = 0;
    }

    Logger.Info(">>> Starting a new window from column ", ColumnStart);
}